

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void do_const_prop(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  char *pcVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int in_ECX;
  dill_stream c_00;
  long in_RDX;
  long *in_RSI;
  dill_stream in_RDI;
  bool bVar6;
  int dest_vreg_5;
  int dest_vreg_4;
  int store;
  int dest_vreg_3;
  int dest_vreg_2;
  int dest_vreg_1;
  int dest_vreg;
  virtual_insn *ip_2;
  int k_2;
  int found_1;
  int mov_dest;
  int mov_src;
  virtual_insn *ip_1;
  int vdest;
  int k_1;
  virtual_insn *ip;
  int k;
  int found;
  virtual_insn *set_ip;
  void *in_stack_00000218;
  void *in_stack_00000220;
  dill_stream in_stack_00000228;
  basic_block_conflict in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar7;
  int local_58;
  int local_54;
  int local_3c;
  int local_30;
  int local_2c;
  
  pcVar5 = (char *)(in_RDX + (long)in_ECX * 0x28);
  if ((*pcVar5 == '\a') && (iVar3 = has_single_def_use(in_RDI,*(int *)(pcVar5 + 8)), iVar3 != 0)) {
    local_2c = 0;
    if (in_RDI->dill_debug != 0) {
      printf(" Forward propagating    ");
      virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
      printf("\n");
    }
    for (local_30 = in_ECX + 1; (long)local_30 <= in_RSI[1] && local_2c == 0;
        local_30 = local_30 + 1) {
      local_2c = const_prop_ip(_k_2,(basic_block_conflict)ip_2,_dest_vreg_1,_dest_vreg_3,store);
    }
  }
  else if (*pcVar5 == '\a') {
    iVar3 = insn_defines((virtual_insn *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RDI->dill_debug != 0) {
      printf(" Forward propagating const    ");
      virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
      printf("\n");
    }
    local_3c = in_ECX + 1;
    while( true ) {
      bVar6 = false;
      if ((long)local_3c <= in_RSI[1]) {
        iVar7 = iVar3;
        iVar4 = insn_defines((virtual_insn *)CONCAT44(iVar3,in_stack_ffffffffffffff78));
        bVar6 = iVar7 != iVar4;
      }
      if (!bVar6) break;
      const_prop_ip(_k_2,(basic_block_conflict)ip_2,_dest_vreg_1,_dest_vreg_3,store);
      local_3c = local_3c + 1;
    }
    if ((long)local_3c <= in_RSI[1]) {
      const_prop_ip(_k_2,(basic_block_conflict)ip_2,_dest_vreg_1,_dest_vreg_3,store);
    }
  }
  else if (((*pcVar5 == '\t') ||
           ((*pcVar5 == '\x04' && (iVar3 = is_convert_noop((int)pcVar5[1]), iVar3 != 0)))) &&
          (iVar3 = has_single_def_use(in_RDI,*(int *)(pcVar5 + 0xc)), iVar3 != 0)) {
    iVar3 = *(int *)(pcVar5 + 0xc);
    uVar2 = *(undefined4 *)(pcVar5 + 8);
    local_54 = 0;
    if (in_RDI->dill_debug != 0) {
      printf(" mov propagating    ");
      virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
      printf("\n");
    }
    for (local_58 = in_ECX + -1; *in_RSI < (long)local_58 && local_54 == 0; local_58 = local_58 + -1
        ) {
      pcVar1 = (char *)(in_RDX + (long)local_58 * 0x28);
      c_00 = (dill_stream)(ulong)(uint)(int)*pcVar1;
      switch(c_00) {
      case (dill_stream)0x0:
        if (*(int *)(pcVar1 + 8) == iVar3) {
          if (in_RDI->dill_debug != 0) {
            printf("   Replacing  ");
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf(" with ");
          }
          *(undefined4 *)(pcVar1 + 8) = uVar2;
          if (in_RDI->dill_debug != 0) {
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf("\n");
          }
          *pcVar5 = '\x18';
          set_unused(c_00,in_stack_ffffffffffffff68,0);
          local_54 = local_54 + 1;
        }
        break;
      case (dill_stream)0x1:
        if (*(int *)(pcVar1 + 8) == iVar3) {
          if (in_RDI->dill_debug != 0) {
            printf("   Replacing  ");
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf(" with ");
          }
          *(undefined4 *)(pcVar1 + 8) = uVar2;
          if (in_RDI->dill_debug != 0) {
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf("\n");
          }
          *pcVar5 = '\x18';
          set_unused(c_00,in_stack_ffffffffffffff68,0);
          local_54 = local_54 + 1;
        }
        break;
      case (dill_stream)0x2:
        if (*(int *)(pcVar1 + 8) == iVar3) {
          if (in_RDI->dill_debug != 0) {
            printf("   Replacing  ");
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf(" with ");
          }
          *(undefined4 *)(pcVar1 + 8) = uVar2;
          if (in_RDI->dill_debug != 0) {
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf("\n");
          }
          *pcVar5 = '\x18';
          set_unused(c_00,in_stack_ffffffffffffff68,0);
          local_54 = local_54 + 1;
        }
        break;
      case (dill_stream)0x3:
        break;
      case (dill_stream)0x4:
        if (*(int *)(pcVar1 + 8) == iVar3) {
          if (in_RDI->dill_debug != 0) {
            printf("   Replacing  ");
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf(" with ");
          }
          *(undefined4 *)(pcVar1 + 8) = uVar2;
          if (in_RDI->dill_debug != 0) {
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf("\n");
          }
          *pcVar5 = '\x18';
          set_unused(c_00,in_stack_ffffffffffffff68,0);
          local_54 = local_54 + 1;
        }
        break;
      case (dill_stream)0x5:
        if (((pcVar1[1] & 0x10U) != 0x10) && (*(int *)(pcVar1 + 8) == iVar3)) {
          if (in_RDI->dill_debug != 0) {
            printf("   Replacing  ");
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf(" with ");
          }
          *(int *)(pcVar1 + 8) = iVar3;
          if (in_RDI->dill_debug != 0) {
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf("\n");
          }
          *pcVar5 = '\x18';
          set_unused(c_00,in_stack_ffffffffffffff68,0);
          local_54 = local_54 + 1;
        }
        break;
      case (dill_stream)0x6:
        break;
      case (dill_stream)0x7:
        break;
      case (dill_stream)0x8:
        break;
      case (dill_stream)0x9:
        if (*(int *)(pcVar1 + 8) == iVar3) {
          if (in_RDI->dill_debug != 0) {
            printf("   Replacing  ");
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf(" with ");
          }
          *(undefined4 *)(pcVar1 + 8) = uVar2;
          if (in_RDI->dill_debug != 0) {
            virtual_print_insn(in_stack_00000228,in_stack_00000220,in_stack_00000218);
            printf("\n");
          }
          *pcVar5 = '\x18';
          set_unused(c_00,in_stack_ffffffffffffff68,0);
          local_54 = local_54 + 1;
        }
        break;
      case (dill_stream)0xa:
      case (dill_stream)0xb:
      case (dill_stream)0xc:
      case (dill_stream)0xd:
      case (dill_stream)0xe:
      case (dill_stream)0xf:
      case (dill_stream)0x10:
      case (dill_stream)0x11:
      case (dill_stream)0x12:
      case (dill_stream)0x13:
      case (dill_stream)0x14:
      case (dill_stream)0x16:
      case (dill_stream)0x17:
      case (dill_stream)0x18:
        break;
      case (dill_stream)0x15:
      }
    }
  }
  return;
}

Assistant:

static void
do_const_prop(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* set_ip = &((virtual_insn*)insns)[loc];
    if ((set_ip->class_code == iclass_set) &&
        has_single_def_use(c, set_ip->opnds.a3i.dest)) {
        int found = 0;
        int k;

        if (c->dill_debug) {
            printf(" Forward propagating    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc + 1; ((k <= bb->end) && (!found)); k++) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            found = const_prop_ip(c, bb, ip, set_ip, 1);
        }
    } else if (set_ip->class_code == iclass_set) {
        int k;
        int vdest = insn_defines(set_ip);
        if (c->dill_debug) {
            printf(" Forward propagating const    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc + 1; ((k <= bb->end) &&
                           (vdest != insn_defines(&((virtual_insn*)insns)[k])));
             k++) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            const_prop_ip(c, bb, ip, set_ip, 0);
        }
        if (k <= bb->end) {
            /* if we ended in insn_defines, substitute the one that defines it
             */
            const_prop_ip(c, bb, &((virtual_insn*)insns)[k], set_ip, 0);
        }
    } else if (((set_ip->class_code == iclass_mov) ||
                ((set_ip->class_code == iclass_convert) &&
                 is_convert_noop(set_ip->insn_code))) &&
               has_single_def_use(c, set_ip->opnds.a2.src)) {
        /* back propagate move */
        int mov_src = set_ip->opnds.a2.src;
        int mov_dest = set_ip->opnds.a2.dest;
        int found = 0;
        int k;

        if (c->dill_debug) {
            printf(" mov propagating    ");
            virtual_print_insn(c, NULL, set_ip);
            printf("\n");
        }
        for (k = loc - 1; ((k > bb->start) && (!found)); k--) {
            virtual_insn* ip = &((virtual_insn*)insns)[k];
            switch (ip->class_code) {
            case iclass_arith3: {
                /* arith 3 operand integer insns */
                int dest_vreg = ip->opnds.a3.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_arith2: {
                /* arith 2 operand integer insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
                break;
            }
            case iclass_arith3i: {
                /* arith 3 immediate operand integer insns */
                int dest_vreg = ip->opnds.a3i.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_ret:
                break;
            case iclass_convert: {
                /* conversion insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_loadstore: {
                int store = ((ip->insn_code & 0x10) == 0x10);
                /* load/store 3 operand integer insns */
                int dest_vreg = ip->opnds.a3.dest;

                if (!store && (dest_vreg == mov_src)) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a3i.dest = mov_src;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_loadstorei:
                break;
            case iclass_lea:
                break;
            case iclass_set:
                break;
            case iclass_setf:
                break;
            case iclass_mov: {
                /* mov insns */
                int dest_vreg = ip->opnds.a2.dest;
                if (dest_vreg == mov_src) {
                    if (c->dill_debug) {
                        printf("   Replacing  ");
                        virtual_print_insn(c, NULL, ip);
                        printf(" with ");
                    }
                    ip->opnds.a2.dest = mov_dest;
                    if (c->dill_debug) {
                        virtual_print_insn(c, NULL, ip);
                        printf("\n");
                    }
                    set_ip->class_code = iclass_nop;
                    set_unused(c, bb, mov_src);
                    found++;
                }
            } break;
            case iclass_reti:
            case iclass_branch:
            case iclass_branchi:
            case iclass_compare:
            case iclass_jump_to_label:
            case iclass_jump_to_reg:
            case iclass_jump_to_imm:
            case iclass_special:
            case iclass_call:
            case iclass_push:
            case iclass_pushi:
            case iclass_pushf:
            case iclass_nop:
            case iclass_mark_label:
                break;
            }
        }
    }
}